

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# TemporaryObject.cpp
# Opt level: O0

void __thiscall
chatra::TemporaryObject::setExplicitSuper(TemporaryObject *this,Reference targetRef,Class *cl)

{
  Class *cl_local;
  TemporaryObject *this_local;
  Reference targetRef_local;
  
  this->type = ExplicitSuper;
  this_local = (TemporaryObject *)targetRef.node;
  Reference::operator=(&this->targetRef,(Reference *)&this_local);
  this->cl = cl;
  clearRestrictions(this);
  return;
}

Assistant:

void TemporaryObject::setExplicitSuper(Reference targetRef, const Class* cl) {
	type = Type::ExplicitSuper;
	this->targetRef = targetRef;
	this->cl = cl;
	clearRestrictions();
}